

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary-ops.cpp
# Opt level: O2

void ggml_compute_forward_log(ggml_compute_params *params,ggml_tensor *dst)

{
  ggml_type gVar1;
  ggml_type gVar2;
  ggml_tensor *src0;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  void *pvVar11;
  void *pvVar12;
  FILE *__stream;
  char cVar13;
  ggml_bf16_t gVar14;
  long lVar15;
  long lVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  char *pcVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  int64_t ir;
  long lVar23;
  float fVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  pair<long,_long> pVar27;
  pair<long,_long> pVar28;
  pair<long,_long> pVar29;
  pair<long,_long> pVar30;
  pair<long,_long> pVar31;
  undefined8 uStack_90;
  long local_50;
  undefined1 extraout_var [60];
  
  __stream = _stderr;
  src0 = dst->src[0];
  gVar1 = dst->type;
  gVar2 = src0->type;
  if (gVar2 == GGML_TYPE_BF16) {
    if (gVar1 == GGML_TYPE_F32) {
      cVar13 = ggml_is_contiguous_1(src0);
      if (((cVar13 != '\0') && (cVar13 = ggml_is_contiguous_1(dst), cVar13 != '\0')) &&
         (cVar13 = ggml_are_same_shape(src0,dst), cVar13 != '\0')) {
        if (dst->nb[0] != 4) {
LAB_0012f030:
          pcVar19 = "nb0 == sizeof(dst_t)";
          uStack_90 = 0x55;
          goto LAB_0012f060;
        }
        if (src0->nb[0] == 2) {
          sVar3 = src0->nb[2];
          sVar4 = src0->nb[3];
          sVar5 = src0->nb[1];
          lVar6 = src0->ne[1];
          lVar21 = src0->ne[2];
          uVar7 = dst->ne[0];
          sVar8 = dst->nb[1];
          sVar9 = dst->nb[2];
          sVar10 = dst->nb[3];
          pVar31 = get_thread_range(params,src0);
          lVar21 = lVar21 * lVar6;
          while( true ) {
            local_50 = pVar31.second;
            lVar23 = pVar31.first;
            if (local_50 <= lVar23) break;
            lVar15 = lVar23 / lVar21;
            lVar20 = lVar23 % lVar21;
            lVar16 = lVar20 / lVar6;
            lVar20 = lVar20 % lVar6;
            pvVar11 = src0->data;
            pvVar12 = dst->data;
            for (uVar22 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar22; uVar22 = uVar22 + 1) {
              fVar24 = logf((float)((uint)*(ushort *)
                                           ((long)pvVar11 +
                                           uVar22 * 2 +
                                           lVar20 * sVar5 + lVar15 * sVar4 + lVar16 * sVar3) << 0x10
                                   ));
              *(float *)((long)pvVar12 +
                        uVar22 * 4 + lVar20 * sVar8 + lVar15 * sVar10 + lVar16 * sVar9) = fVar24;
            }
            pVar31.second = local_50;
            pVar31.first = lVar23 + 1;
          }
          return;
        }
LAB_0012f049:
        pcVar19 = "nb00 == sizeof(src0_t)";
        uStack_90 = 0x56;
        goto LAB_0012f060;
      }
    }
    else {
      if (gVar1 != GGML_TYPE_BF16) goto LAB_0012efdf;
      cVar13 = ggml_is_contiguous_1(src0);
      if (((cVar13 != '\0') && (cVar13 = ggml_is_contiguous_1(dst), cVar13 != '\0')) &&
         (cVar13 = ggml_are_same_shape(src0,dst), cVar13 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_0012f030;
        if (src0->nb[0] == 2) {
          sVar3 = src0->nb[2];
          sVar4 = src0->nb[3];
          sVar5 = src0->nb[1];
          lVar6 = src0->ne[1];
          lVar21 = src0->ne[2];
          uVar7 = dst->ne[0];
          sVar8 = dst->nb[1];
          sVar9 = dst->nb[2];
          sVar10 = dst->nb[3];
          pVar29 = get_thread_range(params,src0);
          lVar21 = lVar21 * lVar6;
          while( true ) {
            local_50 = pVar29.second;
            lVar23 = pVar29.first;
            if (local_50 <= lVar23) break;
            lVar15 = lVar23 / lVar21;
            lVar20 = lVar23 % lVar21;
            lVar16 = lVar20 / lVar6;
            lVar20 = lVar20 % lVar6;
            pvVar11 = src0->data;
            pvVar12 = dst->data;
            for (uVar22 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar22; uVar22 = uVar22 + 1) {
              fVar24 = logf((float)((uint)*(ushort *)
                                           ((long)pvVar11 +
                                           uVar22 * 2 +
                                           lVar20 * sVar5 + lVar15 * sVar4 + lVar16 * sVar3) << 0x10
                                   ));
              gVar14 = f32_to_bf16(fVar24);
              *(uint16_t *)
               ((long)pvVar12 + uVar22 * 2 + lVar20 * sVar8 + lVar15 * sVar10 + lVar16 * sVar9) =
                   gVar14.bits;
            }
            pVar29.second = local_50;
            pVar29.first = lVar23 + 1;
          }
          return;
        }
        goto LAB_0012f049;
      }
    }
  }
  else if (gVar2 == GGML_TYPE_F16) {
    if (gVar1 == GGML_TYPE_F32) {
      cVar13 = ggml_is_contiguous_1(src0);
      if (((cVar13 != '\0') && (cVar13 = ggml_is_contiguous_1(dst), cVar13 != '\0')) &&
         (cVar13 = ggml_are_same_shape(src0,dst), cVar13 != '\0')) {
        if (dst->nb[0] != 4) goto LAB_0012f030;
        if (src0->nb[0] == 2) {
          sVar3 = src0->nb[2];
          sVar4 = src0->nb[3];
          sVar5 = src0->nb[1];
          lVar6 = src0->ne[1];
          lVar21 = src0->ne[2];
          uVar7 = dst->ne[0];
          sVar8 = dst->nb[1];
          sVar9 = dst->nb[2];
          sVar10 = dst->nb[3];
          pVar30 = get_thread_range(params,src0);
          lVar21 = lVar21 * lVar6;
          while( true ) {
            local_50 = pVar30.second;
            lVar23 = pVar30.first;
            if (local_50 <= lVar23) break;
            lVar15 = lVar23 / lVar21;
            lVar20 = lVar23 % lVar21;
            lVar16 = lVar20 / lVar6;
            lVar20 = lVar20 % lVar6;
            pvVar11 = src0->data;
            pvVar12 = dst->data;
            for (uVar22 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar22; uVar22 = uVar22 + 1) {
              fVar24 = logf(*(float *)(&ggml_table_f32_f16 +
                                      (ulong)*(ushort *)
                                              ((long)pvVar11 +
                                              uVar22 * 2 +
                                              lVar20 * sVar5 + lVar15 * sVar4 + lVar16 * sVar3) * 4)
                           );
              *(float *)((long)pvVar12 +
                        uVar22 * 4 + lVar20 * sVar8 + lVar15 * sVar10 + lVar16 * sVar9) = fVar24;
            }
            pVar30.second = local_50;
            pVar30.first = lVar23 + 1;
          }
          return;
        }
        goto LAB_0012f049;
      }
    }
    else {
      if (gVar1 != GGML_TYPE_F16) goto LAB_0012efdf;
      cVar13 = ggml_is_contiguous_1(src0);
      if (((cVar13 != '\0') && (cVar13 = ggml_is_contiguous_1(dst), cVar13 != '\0')) &&
         (cVar13 = ggml_are_same_shape(src0,dst), cVar13 != '\0')) {
        if (dst->nb[0] != 2) goto LAB_0012f030;
        if (src0->nb[0] == 2) {
          sVar3 = src0->nb[2];
          sVar4 = src0->nb[3];
          sVar5 = src0->nb[1];
          lVar6 = src0->ne[1];
          lVar21 = src0->ne[2];
          uVar7 = dst->ne[0];
          pVar28 = get_thread_range(params,src0);
          lVar21 = lVar21 * lVar6;
          while( true ) {
            local_50 = pVar28.second;
            lVar23 = pVar28.first;
            if (local_50 <= lVar23) break;
            lVar15 = lVar23 % lVar21;
            pvVar11 = src0->data;
            for (uVar22 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar22; uVar22 = uVar22 + 1) {
              auVar26._0_4_ =
                   logf(*(float *)(&ggml_table_f32_f16 +
                                  (ulong)*(ushort *)
                                          ((long)pvVar11 +
                                          uVar22 * 2 +
                                          (lVar15 % lVar6) * sVar5 + (lVar23 / lVar21) * sVar4 +
                                          (lVar15 / lVar6) * sVar3) * 4));
              auVar26._4_60_ = extraout_var;
              auVar25 = vcvtps2ph_f16c(auVar26._0_16_,0);
              vpextrw_avx(auVar25,0);
            }
            pVar28.second = local_50;
            pVar28.first = lVar23 + 1;
          }
          return;
        }
        goto LAB_0012f049;
      }
    }
  }
  else {
    if ((gVar2 != GGML_TYPE_F32) || (gVar1 != GGML_TYPE_F32)) {
LAB_0012efdf:
      uVar17 = ggml_type_name();
      uVar18 = ggml_type_name(src0->type);
      fprintf(__stream,"%s: unsupported types: dst: %s, src0: %s\n","unary_op",uVar17,uVar18);
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
                 ,0x78,"fatal error");
    }
    cVar13 = ggml_is_contiguous_1(src0);
    if (((cVar13 != '\0') && (cVar13 = ggml_is_contiguous_1(dst), cVar13 != '\0')) &&
       (cVar13 = ggml_are_same_shape(src0,dst), cVar13 != '\0')) {
      if (dst->nb[0] != 4) goto LAB_0012f030;
      if (src0->nb[0] == 4) {
        sVar3 = src0->nb[2];
        sVar4 = src0->nb[3];
        sVar5 = src0->nb[1];
        lVar6 = src0->ne[1];
        lVar21 = src0->ne[2];
        uVar7 = dst->ne[0];
        sVar8 = dst->nb[1];
        sVar9 = dst->nb[2];
        sVar10 = dst->nb[3];
        pVar27 = get_thread_range(params,src0);
        lVar21 = lVar21 * lVar6;
        while( true ) {
          local_50 = pVar27.second;
          lVar23 = pVar27.first;
          if (local_50 <= lVar23) break;
          lVar15 = lVar23 / lVar21;
          lVar20 = lVar23 % lVar21;
          lVar16 = lVar20 / lVar6;
          lVar20 = lVar20 % lVar6;
          pvVar11 = src0->data;
          pvVar12 = dst->data;
          for (uVar22 = 0; (~((long)uVar7 >> 0x3f) & uVar7) != uVar22; uVar22 = uVar22 + 1) {
            fVar24 = logf(*(float *)((long)pvVar11 +
                                    uVar22 * 4 + lVar20 * sVar5 + lVar15 * sVar4 + lVar16 * sVar3));
            *(float *)((long)pvVar12 +
                      uVar22 * 4 + lVar20 * sVar8 + lVar15 * sVar10 + lVar16 * sVar9) = fVar24;
          }
          pVar27.second = local_50;
          pVar27.first = lVar23 + 1;
        }
        return;
      }
      goto LAB_0012f049;
    }
  }
  pcVar19 = 
  "ggml_is_contiguous_1(src0) && ggml_is_contiguous_1(dst) && ggml_are_same_shape(src0, dst)";
  uStack_90 = 0x51;
LAB_0012f060:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/unary-ops.cpp"
             ,uStack_90,"GGML_ASSERT(%s) failed",pcVar19);
}

Assistant:

void ggml_compute_forward_log(const ggml_compute_params * params, ggml_tensor * dst) {
    unary_op<op_log>(params, dst);
}